

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O0

void __thiscall cmComputeTargetDepends::ComputeIntermediateGraph(cmComputeTargetDepends *this)

{
  cmValue this_00;
  bool bVar1;
  TargetType TVar2;
  size_type __new_size;
  value_type *pvVar3;
  reference inputEdges;
  reference outputEdges;
  reference ppcVar4;
  allocator<char> local_61;
  string local_60;
  cmValue local_40;
  cmValue optimizeDependencies;
  cmGeneratorTarget *gt;
  value_type *intermediateEdges;
  value_type *initialEdges;
  size_t i;
  size_t n;
  cmComputeTargetDepends *this_local;
  
  std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::resize
            (&(this->IntermediateGraph).
              super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,0);
  __new_size = std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::size
                         (&(this->InitialGraph).
                           super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>);
  std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::resize
            (&(this->IntermediateGraph).
              super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,__new_size);
  pvVar3 = (value_type *)
           std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::size
                     (&(this->InitialGraph).
                       super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>);
  for (initialEdges = (value_type *)0x0; initialEdges < pvVar3;
      initialEdges = (value_type *)
                     ((long)&(initialEdges->super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>)
                             .super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>._M_impl.
                             super__Vector_impl_data._M_start + 1)) {
    inputEdges = std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::operator[]
                           (&(this->InitialGraph).
                             super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,
                            (size_type)initialEdges);
    outputEdges = std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::operator[]
                            (&(this->IntermediateGraph).
                              super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,
                             (size_type)initialEdges);
    ppcVar4 = std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
              operator[](&this->Targets,(size_type)initialEdges);
    optimizeDependencies.Value = (string *)*ppcVar4;
    TVar2 = cmGeneratorTarget::GetType((cmGeneratorTarget *)optimizeDependencies.Value);
    if ((TVar2 == STATIC_LIBRARY) ||
       (TVar2 = cmGeneratorTarget::GetType((cmGeneratorTarget *)optimizeDependencies.Value),
       TVar2 == OBJECT_LIBRARY)) {
      this_00.Value = optimizeDependencies.Value;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_60,"OPTIMIZE_DEPENDENCIES",&local_61);
      local_40 = cmGeneratorTarget::GetProperty(this_00.Value,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      std::allocator<char>::~allocator(&local_61);
      bVar1 = cmValue::operator_cast_to_bool(&local_40);
      if (bVar1) {
        bVar1 = cmValue::IsOn(&local_40);
        if (bVar1) {
          OptimizeLinkDependencies
                    (this,(cmGeneratorTarget *)optimizeDependencies.Value,outputEdges,inputEdges);
        }
        else {
          cmGraphEdgeList::operator=(outputEdges,inputEdges);
        }
      }
      else {
        cmGraphEdgeList::operator=(outputEdges,inputEdges);
      }
    }
    else {
      cmGraphEdgeList::operator=(outputEdges,inputEdges);
    }
  }
  return;
}

Assistant:

void cmComputeTargetDepends::ComputeIntermediateGraph()
{
  this->IntermediateGraph.resize(0);
  this->IntermediateGraph.resize(this->InitialGraph.size());

  size_t n = this->InitialGraph.size();
  for (size_t i = 0; i < n; ++i) {
    auto const& initialEdges = this->InitialGraph[i];
    auto& intermediateEdges = this->IntermediateGraph[i];
    cmGeneratorTarget const* gt = this->Targets[i];
    if (gt->GetType() != cmStateEnums::STATIC_LIBRARY &&
        gt->GetType() != cmStateEnums::OBJECT_LIBRARY) {
      intermediateEdges = initialEdges;
    } else {
      if (cmValue optimizeDependencies =
            gt->GetProperty("OPTIMIZE_DEPENDENCIES")) {
        if (optimizeDependencies.IsOn()) {
          this->OptimizeLinkDependencies(gt, intermediateEdges, initialEdges);
        } else {
          intermediateEdges = initialEdges;
        }
      } else {
        intermediateEdges = initialEdges;
      }
    }
  }
}